

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O1

void __thiscall
chrono::ChFile_ps::DrawGraphXY(ChFile_ps *this,ChArray<> *Yvalues,ChArray<> *Xvalues)

{
  ChStreamOutAscii *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ChVector2<double> local_70;
  ChVector2<double> local_60;
  ChVector2<double> local_50;
  ChVector2<double> local_40;
  
  this_00 = &(this->super_ChStreamOutAsciiFile).super_ChStreamOutAscii;
  ChStreamOutAscii::operator<<(this_00,"GS\n");
  local_40.m_data[0] = (this->G_p).m_data[0];
  local_40.m_data[1] = (this->G_p).m_data[1];
  local_50.m_data[0] = (this->Gs_p).m_data[0];
  local_50.m_data[1] = (this->Gs_p).m_data[1];
  ClipRectangle(this,&local_40,&local_50,PAGE);
  uVar4 = (uint)(Xvalues->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows;
  uVar3 = (uint)(Yvalues->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows;
  if ((int)uVar3 < (int)uVar4) {
    uVar4 = uVar3;
  }
  if (uVar4 != 0) {
    ChStreamOutAscii::operator<<(this_00,"NP\n");
    if (0 < (int)uVar4) {
      uVar5 = 0;
      do {
        if (((Xvalues->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows <= (long)uVar5) ||
           ((Yvalues->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows <= (long)uVar5)) {
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Array<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Array<double, -1, 1>, Level = 0]"
                       );
        }
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (this->Gz).m_data[0];
        auVar6._8_8_ = 0;
        auVar6._0_8_ = (Xvalues->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data[uVar5] - (this->Gc_g).m_data[0];
        auVar8._8_8_ = 0;
        auVar8._0_8_ = (this->Gs_p).m_data[0] * 0.5 + (this->G_p).m_data[0];
        auVar1 = vfmadd132sd_fma(auVar6,auVar8,auVar1);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (this->Gz).m_data[1];
        auVar7._8_8_ = 0;
        auVar7._0_8_ = (Yvalues->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data[uVar5] - (this->Gc_g).m_data[1];
        auVar9._8_8_ = 0;
        auVar9._0_8_ = (this->Gs_p).m_data[1] * 0.5 + (this->G_p).m_data[1];
        auVar2 = vfmadd132sd_fma(auVar7,auVar9,auVar2);
        if (uVar5 == 0) {
          local_60.m_data[0] = auVar1._0_8_;
          local_60.m_data[1] = auVar2._0_8_;
          MoveTo(this,&local_60);
        }
        else {
          local_70.m_data[0] = auVar1._0_8_;
          local_70.m_data[1] = auVar2._0_8_;
          AddLinePoint(this,&local_70);
        }
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    ChStreamOutAscii::operator<<(this_00,"SK\n");
    ChStreamOutAscii::operator<<(this_00,"GR\n");
    return;
  }
  return;
}

Assistant:

void ChFile_ps::DrawGraphXY(const ChArray<>& Yvalues, const ChArray<>& Xvalues) {
    // Set clip region
    GrSave();
    ClipToGraph();

    int points = std::min((int)Xvalues.size(), (int)Yvalues.size());
    if (points == 0)
        return;

    StartLine();
    ChVector2<> mp;
    for (int i = 0; i < points; i++) {
        mp.x() = Xvalues(i);
        mp.y() = Yvalues(i);
        mp = To_page_from_graph(mp);
        if (i == 0)
            MoveTo(mp);
        else
            AddLinePoint(mp);
    }
    PaintStroke();

    GrRestore();
}